

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Opnd * __thiscall Lowerer::GetFuncObjectOpnd(Lowerer *this,Instr *insertBeforeInstr)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  StackSym *stackSym;
  JITTimeFunctionBody *this_01;
  undefined4 *puVar3;
  RegOpnd *baseOpnd;
  RegOpnd *tmpOpnd;
  StackSym *paramSym;
  Opnd *paramOpnd;
  Func *func;
  Instr *insertBeforeInstr_local;
  Lowerer *this_local;
  
  this_00 = insertBeforeInstr->m_func;
  bVar2 = Func::IsInlinee(this_00);
  if (bVar2) {
    paramSym = (StackSym *)Func::GetInlineeFunctionObjectSlotOpnd(this_00);
  }
  else {
    stackSym = StackSym::New(TyInt64,this->m_func);
    Func::SetArgOffset(this->m_func,stackSym,0x10);
    Func::SetHasImplicitParamLoad(this->m_func);
    paramSym = (StackSym *)IR::SymOpnd::New(&stackSym->super_Sym,TyInt64,this->m_func);
  }
  this_01 = Func::GetJITFunctionBody(this_00);
  bVar2 = JITTimeFunctionBody::IsCoroutine(this_01);
  if (bVar2) {
    bVar2 = Func::IsInlinee(this_00);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x3557,"(!func->IsInlinee())","!func->IsInlinee()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    baseOpnd = IR::RegOpnd::New(TyInt64,this_00);
    InsertMove(&baseOpnd->super_Opnd,(Opnd *)paramSym,insertBeforeInstr,true);
    offset = Js::GeneratorVirtualScriptFunction::GetRealFunctionOffset();
    paramSym = (StackSym *)IR::IndirOpnd::New(baseOpnd,offset,TyUint64,this_00,false);
  }
  return (Opnd *)paramSym;
}

Assistant:

IR::Opnd*
Lowerer::GetFuncObjectOpnd(IR::Instr* insertBeforeInstr)
{
    Func * func = insertBeforeInstr->m_func;
    IR::Opnd *paramOpnd = nullptr;
    if (func->IsInlinee())
    {
        paramOpnd = func->GetInlineeFunctionObjectSlotOpnd();
    }
    else
    {
#if defined(_M_ARM32_OR_ARM64)
        StackSym * paramSym = this->m_lowererMD.GetImplicitParamSlotSym(0);
#else
        StackSym *paramSym = StackSym::New(TyMachReg, this->m_func);
        this->m_func->SetArgOffset(paramSym, 2 * MachPtr);
        this->m_func->SetHasImplicitParamLoad();
#endif
        paramOpnd = IR::SymOpnd::New(paramSym, TyMachReg, this->m_func);
    }

    if (func->GetJITFunctionBody()->IsCoroutine())
    {
        // the function object for generator calls is a GeneratorVirtualScriptFunction object
        // and we need to return the real JavascriptGeneratorFunction object so grab it before
        // assigning to the dst
        Assert(!func->IsInlinee());
        IR::RegOpnd *tmpOpnd = IR::RegOpnd::New(TyMachReg, func);
        Lowerer::InsertMove(tmpOpnd, paramOpnd, insertBeforeInstr);

        paramOpnd = IR::IndirOpnd::New(tmpOpnd, Js::GeneratorVirtualScriptFunction::GetRealFunctionOffset(), TyMachPtr, func);
    }
    return paramOpnd;
}